

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

Gia_Man_t * Gia_ManFromIfAig(If_Man_t *pIfMan)

{
  If_Cut_t *pCut;
  uint uVar1;
  If_Par_t *pIVar2;
  uint *puVar3;
  Gia_Obj_t *pGVar4;
  void *pvVar5;
  uint uVar6;
  Gia_Man_t *p;
  Vec_Int_t *vAig;
  int *__ptr;
  Vec_Int_t *p_00;
  int *piVar7;
  Vec_Ptr_t *pVVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *pGVar10;
  long lVar11;
  ulong uVar12;
  
  pIVar2 = pIfMan->pPars;
  if (pIVar2->pLutStruct != (char *)0x0) {
    __assert_fail("pIfMan->pPars->pLutStruct == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                  ,0x382,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
  }
  if (((pIVar2->fDelayOpt == 0) && (pIVar2->fDsdBalance == 0)) && (pIVar2->fUserRecLib == 0)) {
    __assert_fail("pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                  ,899,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
  }
  p = Gia_ManStart(pIfMan->vObjs->nSize);
  Gia_ManHashAlloc(p);
  vAig = (Vec_Int_t *)malloc(0x10);
  vAig->nCap = 0x10000;
  vAig->nSize = 0;
  __ptr = (int *)malloc(0x40000);
  vAig->pArray = __ptr;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  p_00->pArray = piVar7;
  pVVar8 = pIfMan->vObjs;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      puVar3 = (uint *)pVVar8->pArray[lVar11];
      uVar1 = *puVar3;
      if ((uVar1 & 0xe) == 2 || puVar3[3] != 0) {
        uVar6 = uVar1 & 0xf;
        switch(uVar6) {
        case 1:
          break;
        case 2:
          pGVar9 = Gia_ManAppendObj(p);
          uVar12 = *(ulong *)pGVar9;
          *(ulong *)pGVar9 = uVar12 | 0x9fffffff;
          *(ulong *)pGVar9 =
               uVar12 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + p->nObjs <= pGVar9)) {
LAB_006bd4b1:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + p->nObjs <= pGVar9)) goto LAB_006bd4b1;
          uVar6 = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
          break;
        case 3:
          if ((int)*(uint *)(*(long *)(puVar3 + 6) + 0x40) < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10f,"int Abc_LitNotCond(int, int)");
          }
          uVar6 = Gia_ManAppendCo(p,*(uint *)(*(long *)(puVar3 + 6) + 0x40) ^ uVar1 >> 4 & 1);
          break;
        case 4:
          p_00->nSize = 0;
          if (0xffffff < puVar3[0x1b]) {
            uVar12 = 0;
            do {
              uVar1 = puVar3[uVar12 + 0x1c];
              if (((long)(int)uVar1 < 0) || (pIfMan->vObjs->nSize <= (int)uVar1)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar5 = pIfMan->vObjs->pArray[(int)uVar1];
              if (pvVar5 == (void *)0x0) break;
              Vec_IntPush(p_00,*(int *)((long)pvVar5 + 0x40));
              uVar12 = uVar12 + 1;
            } while (uVar12 < *(byte *)((long)puVar3 + 0x6f));
          }
          pCut = (If_Cut_t *)(puVar3 + 0x14);
          pIVar2 = pIfMan->pPars;
          if (pIVar2->fDelayOpt == 0) {
            if (pIVar2->fDsdBalance == 0) {
              if (pIVar2->fUserRecLib == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                              ,0x3a4,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
              }
              uVar6 = Abc_RecToGia3(p,pIfMan,pCut,p_00,0);
              break;
            }
            If_CutDsdBalanceEval(pIfMan,pCut,vAig);
          }
          else {
            If_CutSopBalanceEval(pIfMan,pCut,vAig);
          }
          uVar6 = Gia_ManBuildFromMiniInt(p,p_00,vAig,0);
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                        ,0x3ac,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
        }
        puVar3[0x10] = uVar6;
      }
      lVar11 = lVar11 + 1;
      pVVar8 = pIfMan->vObjs;
    } while (lVar11 < pVVar8->nSize);
    __ptr = vAig->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(vAig);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  pGVar10 = Gia_ManRehash(p,0);
  Gia_ManStop(p);
  return pGVar10;
}

Assistant:

Gia_Man_t * Gia_ManFromIfAig( If_Man_t * pIfMan )
{
    int fHash = 0;
    Gia_Man_t * pNew, * pTemp;
    If_Obj_t * pIfObj, * pIfLeaf;
    If_Cut_t * pCutBest;
    Vec_Int_t * vLeaves;
    Vec_Int_t * vAig;
    int i, k;
    assert( pIfMan->pPars->pLutStruct == NULL );
    assert( pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib );
    // create new manager
    pNew = Gia_ManStart( If_ManObjNum(pIfMan) );
    Gia_ManHashAlloc( pNew );
    // iterate through nodes used in the mapping
    vAig = Vec_IntAlloc( 1 << 16 );
    vLeaves = Vec_IntAlloc( 16 );
//    If_ManForEachObj( pIfMan, pIfObj, i )
//        pIfObj->iCopy = 0;
    If_ManForEachObj( pIfMan, pIfObj, i )
    {
        if ( pIfObj->nRefs == 0 && !If_ObjIsTerm(pIfObj) )
            continue;
        if ( If_ObjIsAnd(pIfObj) )
        {
            pCutBest = If_ObjCutBest( pIfObj );
            // if the cut does not offer delay improvement
//            if ( (int)pIfObj->Level <= (int)pCutBest->Delay )
//            {
//                Gia_ManFromIfAig_rec( pNew, pIfMan, pIfObj );
//                continue;
//            }
            // collect leaves of the best cut
            Vec_IntClear( vLeaves );
            If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, k )
                Vec_IntPush( vLeaves, pIfLeaf->iCopy );
            // get the functionality
            if ( pIfMan->pPars->fDelayOpt )
                pIfObj->iCopy = Gia_ManBuildFromMini( pNew, pIfMan, pCutBest, vLeaves, vAig, fHash, 0 );
            else if ( pIfMan->pPars->fDsdBalance )
                pIfObj->iCopy = Gia_ManBuildFromMini( pNew, pIfMan, pCutBest, vLeaves, vAig, fHash, 1 );
            else if ( pIfMan->pPars->fUserRecLib )
                pIfObj->iCopy = Abc_RecToGia3( pNew, pIfMan, pCutBest, vLeaves, fHash );
            else assert( 0 );
        }
        else if ( If_ObjIsCi(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCi(pNew);
        else if ( If_ObjIsCo(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCo( pNew, Abc_LitNotCond(If_ObjFanin0(pIfObj)->iCopy, If_ObjFaninC0(pIfObj)) );
        else if ( If_ObjIsConst1(pIfObj) )
            pIfObj->iCopy = 1;
        else assert( 0 );
    }
    Vec_IntFree( vAig );
    Vec_IntFree( vLeaves );
    pNew = Gia_ManRehash( pTemp = pNew, 0 );
    Gia_ManStop( pTemp );
    return pNew;
}